

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_fpfpcvt(DisasContext_conflict1 *s,int rd,int rn,int opcode,_Bool itof,int rmode,
                   int scale,int sf,int type)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t uVar1;
  int val;
  TCGv_ptr arg2;
  TCGv_i32 arg2_00;
  TCGv_i64 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i64 arg1;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  bool bVar6;
  TCGv_i32 tcg_dest_1;
  TCGv_i32 tcg_dest;
  TCGv_i32 tcg_rmode;
  TCGv_i64 tcg_int_1;
  TCGv_i64 tcg_extend;
  TCGv_i64 tcg_int;
  TCGv_i64 tcg_double;
  TCGv_i32 tcg_single;
  TCGv_i32 tcg_shift;
  TCGv_ptr tcg_fpstatus;
  _Bool is_signed;
  TCGContext_conflict1 *tcg_ctx;
  int rmode_local;
  _Bool itof_local;
  int opcode_local;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar6 = (opcode & 1U) != 0;
  arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,type == 3);
  arg2_00 = tcg_const_i32_aarch64(tcg_ctx_00,0x40 - scale);
  if (itof) {
    pTVar2 = cpu_reg_aarch64(s,rn);
    tcg_extend = pTVar2;
    if (sf == 0) {
      tcg_extend = new_tmp_a64_aarch64(s);
      if (bVar6) {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,tcg_extend,pTVar2);
      }
      else {
        tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,tcg_extend,pTVar2);
      }
    }
    if (type == 0) {
      pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
      if (bVar6) {
        gen_helper_vfp_uqtos(tcg_ctx_00,pTVar3,tcg_extend,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_sqtos(tcg_ctx_00,pTVar3,tcg_extend,arg2_00,arg2);
      }
      write_fp_sreg(s,rd,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    }
    else if (type == 1) {
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      if (bVar6) {
        gen_helper_vfp_uqtod(tcg_ctx_00,pTVar2,tcg_extend,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_sqtod(tcg_ctx_00,pTVar2,tcg_extend,arg2_00,arg2);
      }
      write_fp_dreg_aarch64(s,rd,pTVar2);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
    }
    else {
      if (type != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x1a5c,(char *)0x0);
      }
      pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
      if (bVar6) {
        gen_helper_vfp_uqtoh(tcg_ctx_00,pTVar3,tcg_extend,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_sqtoh(tcg_ctx_00,pTVar3,tcg_extend,arg2_00,arg2);
      }
      write_fp_sreg(s,rd,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    }
  }
  else {
    pTVar2 = cpu_reg_aarch64(s,rd);
    uVar1 = extract32(opcode,2,1);
    tcg_ctx._4_4_ = rmode;
    if (uVar1 != 0) {
      tcg_ctx._4_4_ = 4;
    }
    val = arm_rmode_to_sf_aarch64(tcg_ctx._4_4_);
    pTVar3 = tcg_const_i32_aarch64(tcg_ctx_00,val);
    gen_helper_set_rmode(tcg_ctx_00,pTVar3,pTVar3,arg2);
    if (type == 0) {
      pTVar4 = read_fp_sreg(s,rn);
      if (sf == 0) {
        pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
        if (bVar6) {
          gen_helper_vfp_touls(tcg_ctx_00,pTVar5,pTVar4,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_tosls(tcg_ctx_00,pTVar5,pTVar4,arg2_00,arg2);
        }
        tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,pTVar2,pTVar5);
        tcg_temp_free_i32(tcg_ctx_00,pTVar5);
      }
      else if (bVar6) {
        gen_helper_vfp_touqs(tcg_ctx_00,pTVar2,pTVar4,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_tosqs(tcg_ctx_00,pTVar2,pTVar4,arg2_00,arg2);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    }
    else if (type == 1) {
      arg1 = read_fp_dreg(s,rn);
      if (bVar6) {
        if (sf == 0) {
          gen_helper_vfp_tould(tcg_ctx_00,pTVar2,arg1,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_touqd(tcg_ctx_00,pTVar2,arg1,arg2_00,arg2);
        }
      }
      else if (sf == 0) {
        gen_helper_vfp_tosld(tcg_ctx_00,pTVar2,arg1,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_tosqd(tcg_ctx_00,pTVar2,arg1,arg2_00,arg2);
      }
      if (sf == 0) {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTVar2,pTVar2);
      }
      tcg_temp_free_i64(tcg_ctx_00,arg1);
    }
    else {
      if (type != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x1aba,(char *)0x0);
      }
      pTVar4 = read_fp_sreg(s,rn);
      if (sf == 0) {
        pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
        if (bVar6) {
          gen_helper_vfp_toulh(tcg_ctx_00,pTVar5,pTVar4,arg2_00,arg2);
        }
        else {
          gen_helper_vfp_toslh(tcg_ctx_00,pTVar5,pTVar4,arg2_00,arg2);
        }
        tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,pTVar2,pTVar5);
        tcg_temp_free_i32(tcg_ctx_00,pTVar5);
      }
      else if (bVar6) {
        gen_helper_vfp_touqh(tcg_ctx_00,pTVar2,pTVar4,arg2_00,arg2);
      }
      else {
        gen_helper_vfp_tosqh(tcg_ctx_00,pTVar2,pTVar4,arg2_00,arg2);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    }
    gen_helper_set_rmode(tcg_ctx_00,pTVar3,pTVar3,arg2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
  }
  tcg_temp_free_ptr(tcg_ctx_00,arg2);
  tcg_temp_free_i32(tcg_ctx_00,arg2_00);
  return;
}

Assistant:

static void handle_fpfpcvt(DisasContext *s, int rd, int rn, int opcode,
                           bool itof, int rmode, int scale, int sf, int type)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_signed = !(opcode & 1);
    TCGv_ptr tcg_fpstatus;
    TCGv_i32 tcg_shift, tcg_single;
    TCGv_i64 tcg_double;

    tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, type == 3);

    tcg_shift = tcg_const_i32(tcg_ctx, 64 - scale);

    if (itof) {
        TCGv_i64 tcg_int = cpu_reg(s, rn);
        if (!sf) {
            TCGv_i64 tcg_extend = new_tmp_a64(s);

            if (is_signed) {
                tcg_gen_ext32s_i64(tcg_ctx, tcg_extend, tcg_int);
            } else {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_extend, tcg_int);
            }

            tcg_int = tcg_extend;
        }

        switch (type) {
        case 1: /* float64 */
            tcg_double = tcg_temp_new_i64(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_dreg(s, rd, tcg_double);
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }
    } else {
        TCGv_i64 tcg_int = cpu_reg(s, rd);
        TCGv_i32 tcg_rmode;

        if (extract32(opcode, 2, 1)) {
            /* There are too many rounding modes to all fit into rmode,
             * so FCVTA[US] is a special case.
             */
            rmode = FPROUNDING_TIEAWAY;
        }

        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);

        switch (type) {
        case 1: /* float64 */
            tcg_double = read_fp_dreg(s, rn);
            if (is_signed) {
                if (!sf) {
                    gen_helper_vfp_tosld(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_tosqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                if (!sf) {
                    gen_helper_vfp_tould(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            }
            if (!sf) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_int, tcg_int);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_tosls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_toslh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_toulh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    tcg_temp_free_i32(tcg_ctx, tcg_shift);
}